

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::GenericClassDefSymbol::SpecializationKey::SpecializationKey
          (SpecializationKey *this,GenericClassDefSymbol *def,
          span<const_slang::ConstantValue_*const,_18446744073709551615UL> paramValues,
          span<const_slang::ast::Type_*const,_18446744073709551615UL> typeParams)

{
  size_t local_a8;
  span<const_slang::ast::Type_*const,_18446744073709551615UL> *local_a0;
  size_t local_90;
  Type *local_88;
  Type *type;
  iterator __end2_1;
  iterator __begin2_1;
  span<const_slang::ast::Type_*const,_18446744073709551615UL> *__range2_1;
  ConstantValue *local_60;
  ConstantValue *val;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ConstantValue_*const,_18446744073709551615UL> *__range2;
  size_t h;
  GenericClassDefSymbol *def_local;
  SpecializationKey *this_local;
  span<const_slang::ast::Type_*const,_18446744073709551615UL> typeParams_local;
  span<const_slang::ConstantValue_*const,_18446744073709551615UL> paramValues_local;
  
  typeParams_local.data_ = (pointer)typeParams.size_;
  this_local = (SpecializationKey *)typeParams.data_;
  typeParams_local.size_ = (size_type)paramValues.data_;
  this->definition = def;
  (this->paramValues).data_ = (pointer)typeParams_local.size_;
  (this->paramValues).size_ = paramValues.size_;
  (this->typeParams).data_ = (pointer)this_local;
  (this->typeParams).size_ = (size_type)typeParams_local.data_;
  __range2 = (span<const_slang::ConstantValue_*const,_18446744073709551615UL> *)0x0;
  h = (size_t)def;
  def_local = (GenericClassDefSymbol *)this;
  hash_combine<slang::ast::GenericClassDefSymbol_const*>((size_t *)&__range2,&this->definition);
  __begin2 = (iterator)&typeParams_local.size_;
  __end2 = nonstd::span_lite::span<const_slang::ConstantValue_*const,_18446744073709551615UL>::begin
                     ((span<const_slang::ConstantValue_*const,_18446744073709551615UL> *)__begin2);
  val = (ConstantValue *)
        nonstd::span_lite::span<const_slang::ConstantValue_*const,_18446744073709551615UL>::end
                  ((span<const_slang::ConstantValue_*const,_18446744073709551615UL> *)__begin2);
  for (; (ConstantValue *)__end2 != val; __end2 = __end2 + 1) {
    local_60 = *__end2;
    if (local_60 == (ConstantValue *)0x0) {
      local_a0 = (span<const_slang::ast::Type_*const,_18446744073709551615UL> *)0x0;
    }
    else {
      local_a0 = (span<const_slang::ast::Type_*const,_18446744073709551615UL> *)
                 slang::ConstantValue::hash(local_60);
    }
    __range2_1 = local_a0;
    hash_combine<unsigned_long>((size_t *)&__range2,(unsigned_long *)&__range2_1);
  }
  __begin2_1 = (iterator)&this_local;
  __end2_1 = nonstd::span_lite::span<const_slang::ast::Type_*const,_18446744073709551615UL>::begin
                       ((span<const_slang::ast::Type_*const,_18446744073709551615UL> *)__begin2_1);
  type = (Type *)nonstd::span_lite::span<const_slang::ast::Type_*const,_18446744073709551615UL>::end
                           ((span<const_slang::ast::Type_*const,_18446744073709551615UL> *)
                            __begin2_1);
  for (; (Type *)__end2_1 != type; __end2_1 = __end2_1 + 1) {
    local_88 = *__end2_1;
    if (local_88 == (Type *)0x0) {
      local_a8 = 0;
    }
    else {
      local_a8 = Type::hash(local_88);
    }
    local_90 = local_a8;
    hash_combine<unsigned_long>((size_t *)&__range2,&local_90);
  }
  this->savedHash = (size_t)__range2;
  return;
}

Assistant:

GenericClassDefSymbol::SpecializationKey::SpecializationKey(
    const GenericClassDefSymbol& def, span<const ConstantValue* const> paramValues,
    span<const Type* const> typeParams) :
    definition(&def),
    paramValues(paramValues), typeParams(typeParams) {

    // Precompute the hash.
    size_t h = 0;
    hash_combine(h, definition);
    for (auto val : paramValues)
        hash_combine(h, val ? val->hash() : 0);
    for (auto type : typeParams)
        hash_combine(h, type ? type->hash() : 0);
    savedHash = h;
}